

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall TApp_IniFlags_Test::TestBody(TApp_IniFlags_Test *this)

{
  App *this_00;
  bool bVar1;
  char *pcVar2;
  bool five;
  bool four;
  bool three;
  int two;
  TempFile tmpini;
  ofstream out;
  Message local_3e0;
  AssertHelper local_3d8;
  bool local_3cf;
  bool local_3ce;
  bool local_3cd;
  int local_3cc;
  TempFile local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  long local_228;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220 [30];
  ios_base local_130 [264];
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"TestIniTmp.ini","");
  TempFile::TempFile(&local_3c8,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--config","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_3c8._name._M_dataplus._M_p,
             local_3c8._name._M_dataplus._M_p + local_3c8._name._M_string_length);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Read an ini file","");
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_268,&local_288,&local_2a8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  std::ofstream::ofstream(&local_228,(string *)&local_3c8,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"[default]",9);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"two=2",5);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"three=true",10);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"four=on",7);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"five",4);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  local_228 = _VTT;
  *(undefined8 *)((long)&local_220[-1].ptr_ + *(long *)(_VTT + -0x18)) =
       ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)local_220);
  std::ios_base::~ios_base(local_130);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--two","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"");
  CLI::App::add_flag<int,_(CLI::detail::enabler)0>(this_00,&local_2c8,&local_3cc,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"--three","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_308,&local_3cd,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"--four","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_348,&local_3ce,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--five","");
  pcVar2 = "";
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_388,&local_3cf,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  local_3e0.ss_.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"2","two",(int *)&local_3e0,&local_3cc);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message(&local_3e0);
    if (local_220[0].ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_220[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x221,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e0.ss_.ptr_._0_4_ = CONCAT31(local_3e0.ss_.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_228,"true","three",(bool *)&local_3e0,&local_3cd);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message(&local_3e0);
    if (local_220[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e0.ss_.ptr_._0_4_ = CONCAT31(local_3e0.ss_.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_228,"true","four",(bool *)&local_3e0,&local_3ce);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message(&local_3e0);
    if (local_220[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x223,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e0.ss_.ptr_._0_4_ = CONCAT31(local_3e0.ss_.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_228,"true","five",(bool *)&local_3e0,&local_3cf);
  if (local_228._0_1_ == (ostream)0x0) {
    testing::Message::Message(&local_3e0);
    if (local_220[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x224,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e0.ss_.ptr_._4_4_,local_3e0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  remove(local_3c8._name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._name._M_dataplus._M_p != &local_3c8._name.field_2) {
    operator_delete(local_3c8._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniFlags) {
    TempFile tmpini{"TestIniTmp.ini"};
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=2" << std::endl;
        out << "three=true" << std::endl;
        out << "four=on" << std::endl;
        out << "five" << std::endl;
    }

    int two;
    bool three, four, five;
    app.add_flag("--two", two);
    app.add_flag("--three", three);
    app.add_flag("--four", four);
    app.add_flag("--five", five);

    run();

    EXPECT_EQ(2, two);
    EXPECT_EQ(true, three);
    EXPECT_EQ(true, four);
    EXPECT_EQ(true, five);
}